

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O2

void __thiscall
HostVector_std_vector_constructor_Test::HostVector_std_vector_constructor_Test
          (HostVector_std_vector_constructor_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0015fd70;
  return;
}

Assistant:

TEST(HostVector, std_vector_constructor) {
    using namespace memory;

    std::vector<int> v(10);
    std::iota(v.begin(), v.end(), 0);

    HostVector<int> hv(v);

    for(auto i=0; i<hv.size(); ++i) {
        EXPECT_EQ(v[i], hv[i]);
    }
}